

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

void gl4cts::GLSL420Pack::Utils::prepareVariableStrings
               (SHADER_STAGES in_stage,VARIABLE_STORAGE in_storage,qualifierSet *in_qualifiers,
               GLchar *in_type_name,GLchar *in_variable_name,string *out_definition,
               string *out_reference)

{
  qualifierSet *pqVar1;
  VARIABLE_FLAVOUR VVar2;
  VARIABLE_FLAVOUR flavour_00;
  GLchar *type_name;
  GLchar *qualifiers_00;
  string local_d0;
  string local_b0;
  string local_80;
  string *local_60;
  string *name;
  qualifierSet *local_40;
  qualifierSet *qualifiers;
  string *psStack_30;
  VARIABLE_FLAVOUR flavour;
  string *out_definition_local;
  GLchar *in_variable_name_local;
  GLchar *in_type_name_local;
  qualifierSet *in_qualifiers_local;
  VARIABLE_STORAGE in_storage_local;
  SHADER_STAGES in_stage_local;
  
  psStack_30 = out_definition;
  out_definition_local = (string *)in_variable_name;
  in_variable_name_local = in_type_name;
  in_type_name_local = (GLchar *)in_qualifiers;
  in_qualifiers_local._0_4_ = in_storage;
  in_qualifiers_local._4_4_ = in_stage;
  qualifiers._4_4_ = getVariableFlavour(in_stage,in_storage,in_qualifiers);
  prepareQualifiersSet
            ((qualifierSet *)&name,(qualifierSet *)in_type_name_local,in_qualifiers_local._4_4_,
             (VARIABLE_STORAGE)in_qualifiers_local);
  local_40 = (qualifierSet *)&name;
  getVariableName_abi_cxx11_
            (&local_80,(Utils *)(ulong)in_qualifiers_local._4_4_,
             (VARIABLE_STORAGE)in_qualifiers_local,(VARIABLE_STORAGE)out_definition_local,
             in_variable_name);
  qualifiers_00 = in_variable_name_local;
  VVar2 = qualifiers._4_4_;
  pqVar1 = local_40;
  local_60 = &local_80;
  type_name = (GLchar *)std::__cxx11::string::c_str();
  getVariableDefinition_abi_cxx11_
            (&local_b0,(Utils *)(ulong)VVar2,(VARIABLE_FLAVOUR)pqVar1,(qualifierSet *)qualifiers_00,
             type_name,(GLchar *)out_definition);
  std::__cxx11::string::operator=((string *)psStack_30,(string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  VVar2 = qualifiers._4_4_;
  flavour_00 = std::__cxx11::string::c_str();
  getVariableReference_abi_cxx11_(&local_d0,(Utils *)(ulong)VVar2,flavour_00,qualifiers_00);
  std::__cxx11::string::operator=((string *)out_reference,(string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_80);
  std::
  vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
  ::~vector((vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
             *)&name);
  return;
}

Assistant:

void Utils::prepareVariableStrings(Utils::SHADER_STAGES in_stage, Utils::VARIABLE_STORAGE in_storage,
								   const Utils::qualifierSet& in_qualifiers, const glw::GLchar* in_type_name,
								   const glw::GLchar* in_variable_name, std::string& out_definition,
								   std::string& out_reference)
{
	VARIABLE_FLAVOUR	flavour	= getVariableFlavour(in_stage, in_storage, in_qualifiers);
	const qualifierSet& qualifiers = prepareQualifiersSet(in_qualifiers, in_stage, in_storage);
	const std::string&  name	   = getVariableName(in_stage, in_storage, in_variable_name);

	out_definition = getVariableDefinition(flavour, qualifiers, in_type_name, name.c_str());
	out_reference  = getVariableReference(flavour, name.c_str());
}